

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O2

vector<StringPiece,_std::allocator<StringPiece>_> *
SplitStringPiece(vector<StringPiece,_std::allocator<StringPiece>_> *__return_storage_ptr__,
                StringPiece input,char sep)

{
  difference_type dVar1;
  char *pcVar2;
  char *__first;
  char *__last;
  char local_41;
  StringPiece local_40;
  
  __first = input.str_;
  (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __last = __first + input.len_;
  local_41 = sep;
  dVar1 = std::__count_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (__first,__last,(_Iter_equals_val<const_char>)&local_41);
  std::vector<StringPiece,_std::allocator<StringPiece>_>::reserve(__return_storage_ptr__,dVar1 + 1);
  while( true ) {
    pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (__first,__last,&local_41);
    local_40.str_ = __first;
    if (pcVar2 == __last) break;
    local_40.len_ = (long)pcVar2 - (long)__first;
    std::vector<StringPiece,_std::allocator<StringPiece>_>::emplace_back<StringPiece>
              (__return_storage_ptr__,&local_40);
    __first = pcVar2 + 1;
  }
  local_40.len_ = (long)__last - (long)__first;
  std::vector<StringPiece,_std::allocator<StringPiece>_>::emplace_back<StringPiece>
            (__return_storage_ptr__,&local_40);
  return __return_storage_ptr__;
}

Assistant:

vector<StringPiece> SplitStringPiece(StringPiece input, char sep) {
  vector<StringPiece> elems;
  elems.reserve(count(input.begin(), input.end(), sep) + 1);

  StringPiece::const_iterator pos = input.begin();

  for (;;) {
    const char* next_pos = find(pos, input.end(), sep);
    if (next_pos == input.end()) {
      elems.push_back(StringPiece(pos, input.end() - pos));
      break;
    }
    elems.push_back(StringPiece(pos, next_pos - pos));
    pos = next_pos + 1;
  }

  return elems;
}